

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O0

void __thiscall DSectorEffect::Destroy(DSectorEffect *this)

{
  bool bVar1;
  DSectorEffect *this_local;
  
  if (this->m_Sector != (sector_t_conflict *)0x0) {
    bVar1 = TObjPtr<DSectorEffect>::operator==(&this->m_Sector->floordata,this);
    if (bVar1) {
      TObjPtr<DSectorEffect>::operator=(&this->m_Sector->floordata,(DSectorEffect *)0x0);
    }
    bVar1 = TObjPtr<DSectorEffect>::operator==(&this->m_Sector->ceilingdata,this);
    if (bVar1) {
      TObjPtr<DSectorEffect>::operator=(&this->m_Sector->ceilingdata,(DSectorEffect *)0x0);
    }
    bVar1 = TObjPtr<DSectorEffect>::operator==(&this->m_Sector->lightingdata,this);
    if (bVar1) {
      TObjPtr<DSectorEffect>::operator=(&this->m_Sector->lightingdata,(DSectorEffect *)0x0);
    }
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DSectorEffect::Destroy()
{
	if (m_Sector)
	{
		if (m_Sector->floordata == this)
		{
			m_Sector->floordata = NULL;
		}
		if (m_Sector->ceilingdata == this)
		{
			m_Sector->ceilingdata = NULL;
		}
		if (m_Sector->lightingdata == this)
		{
			m_Sector->lightingdata = NULL;
		}
	}
	Super::Destroy();
}